

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pparsefp.h
# Opt level: O3

char * parse_double(char *buf,size_t len,double *result)

{
  char cVar1;
  bool bVar2;
  undefined1 auVar3 [12];
  long lVar4;
  long lVar5;
  byte *pbVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  char *pcVar10;
  char cVar11;
  byte *pbVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  byte *pbVar22;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  double dVar26;
  grisu3_diy_fp_t n;
  grisu3_diy_fp_t gVar27;
  byte *local_38;
  
  *result = 0.0;
  lVar5 = len + 1;
  if (1000 < len) {
    lVar5 = 0x3e9;
  }
  cVar1 = *buf;
  pcVar10 = buf;
  cVar11 = cVar1;
  if (cVar1 == '-') {
    if (lVar5 == 1) {
      return (char *)0x0;
    }
    pcVar10 = buf + 1;
    cVar11 = buf[1];
  }
  pbVar6 = (byte *)(buf + lVar5);
  if (cVar11 == '0') {
    pbVar12 = (byte *)(pcVar10 + 1);
    if (pbVar12 == pbVar6) {
      return (char *)0x0;
    }
    if ((*pbVar12 & 0xdf) == 0x58) {
      return buf;
    }
    if (*pbVar12 == 0x30) {
      pbVar22 = (byte *)(pcVar10 + 2);
      do {
        pbVar12 = pbVar22;
        if (pbVar12 == pbVar6) {
          return (char *)0x0;
        }
        pbVar22 = pbVar12 + 1;
      } while (*pbVar12 == 0x30);
    }
    uVar18 = 0;
  }
  else {
    if ((byte)(cVar11 - 0x3aU) < 0xf7) {
      if (cVar1 == '-') {
        return (char *)0x0;
      }
      return buf;
    }
    pbVar12 = (byte *)(pcVar10 + 1);
    uVar18 = (ulong)(byte)(cVar11 - 0x30);
  }
  if (pbVar12 == pbVar6) {
    return (char *)0x0;
  }
  iVar21 = 0;
  lVar5 = 0;
  pbVar22 = pbVar12;
  while( true ) {
    bVar7 = *pbVar22 - 0x30;
    if (9 < bVar7) break;
    if (0x1999999999999998 < uVar18) {
      uVar18 = (uVar18 + 1) - (ulong)(*pbVar22 < 0x35);
      iVar21 = 1;
      break;
    }
    pbVar22 = pbVar22 + 1;
    uVar18 = (ulong)bVar7 + uVar18 * 10;
    lVar5 = lVar5 + -1;
    if (pbVar22 == pbVar6) {
      return (char *)0x0;
    }
  }
  if (pbVar22 == pbVar6) {
    return (char *)0x0;
  }
  iVar23 = -(uint)lVar5;
  uVar15 = 0;
  while (pbVar22[uVar15] == 0x30) {
    lVar4 = uVar15 + (1 - lVar5);
    uVar15 = uVar15 + 1;
    if (pbVar12 + lVar4 == pbVar6) {
      return (char *)0x0;
    }
  }
  if ((byte)(pbVar22[uVar15] - 0x31) < 9) {
    pbVar12 = pbVar12 + uVar15 + (1 - lVar5);
    do {
      pbVar22 = pbVar12;
      if (pbVar22 == pbVar6) {
        return (char *)0x0;
      }
      uVar15 = (ulong)((int)uVar15 + 1);
      pbVar12 = pbVar22 + 1;
    } while ((byte)(*pbVar22 - 0x30) < 10);
    iVar21 = 1;
  }
  else {
    pbVar22 = pbVar22 + uVar15;
  }
  iVar9 = (int)uVar15;
  pbVar12 = pbVar22;
  if ((pbVar22 != pbVar6) && (*pbVar22 == 0x2e)) {
    if ((byte)(pbVar22[1] - 0x3a) < 0xf6) {
      return (char *)0x0;
    }
    while (pbVar12 = pbVar12 + 1, pbVar12 != pbVar6) {
      bVar7 = *pbVar12 - 0x30;
      if (9 < bVar7) break;
      if (0x1999999999999998 < uVar18) {
        bVar25 = iVar21 == 0;
        iVar21 = 1;
        if (bVar25) {
          uVar18 = (uVar18 + 1) - (ulong)(*pbVar12 < 0x35);
        }
        break;
      }
      uVar18 = (ulong)bVar7 + uVar18 * 10;
      uVar15 = (ulong)((int)uVar15 - 1);
    }
    iVar23 = ~(uint)lVar5 + ((int)pbVar12 - (int)pbVar22);
    for (; iVar9 = (int)uVar15, pbVar12 != pbVar6; pbVar12 = pbVar12 + 1) {
      if (*pbVar12 != 0x30) {
        if ((byte)(*pbVar12 - 0x31) < 9) goto LAB_00123ffa;
        break;
      }
      uVar15 = (ulong)(iVar9 + 1);
    }
  }
  goto LAB_00123eef;
  while ((byte)(*pbVar12 - 0x30) < 10) {
LAB_00123ffa:
    pbVar12 = pbVar12 + 1;
    if (pbVar12 == pbVar6) break;
  }
  iVar21 = 1;
LAB_00123eef:
  bVar25 = false;
  if ((pbVar12 == pbVar6) || ((*pbVar12 & 0xdf) != 0x45)) {
    uVar8 = 0;
  }
  else {
    bVar25 = false;
    if ((long)pbVar6 - (long)pbVar12 < 2) {
      return (char *)0x0;
    }
    if (pbVar12[1] == 0x2d) {
      bVar25 = true;
LAB_001240ae:
      pbVar12 = pbVar12 + 2;
      if (pbVar12 == pbVar6) {
        return (char *)0x0;
      }
    }
    else {
      if (pbVar12[1] == 0x2b) {
        bVar25 = false;
        goto LAB_001240ae;
      }
      pbVar12 = pbVar12 + 1;
    }
    if ((byte)(*pbVar12 - 0x3a) < 0xf6) {
      return (char *)0x0;
    }
    uVar8 = (uint)(byte)(*pbVar12 - 0x30);
    while ((pbVar12 = pbVar12 + 1, pbVar12 != pbVar6 && ((byte)(*pbVar12 - 0x30) < 10))) {
      if ((int)uVar8 < 0x8000) {
        uVar8 = (*pbVar12 - 0x30) + uVar8 * 10;
      }
    }
  }
  if (pbVar12 == pbVar6) {
    return (char *)0x0;
  }
  uVar13 = -uVar8;
  if (!bVar25) {
    uVar13 = uVar8;
  }
  dVar26 = 0.0;
  if ((uVar18 != 0) && (uVar13 = iVar9 + iVar23 + uVar13, -0x145 < (int)uVar13)) {
    if ((int)uVar13 < 0x137) {
      if ((uVar18 >> 0x35 != 0) || (0x16 < uVar13)) {
        uVar13 = uVar13 - iVar23;
        gVar27._8_8_ = 0;
        gVar27.f = uVar18;
        gVar27 = grisu3_diy_fp_normalize(gVar27);
        auVar3 = gVar27._0_12_;
        iVar21 = (iVar21 << 2) << (-(char)gVar27.e & 0x1fU);
        if ((int)uVar13 < -0x15c) {
          __assert_fail("-348 <= d_exp",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                        ,0x4f,"int grisu3_diy_fp_cached_dec_pow(int, grisu3_diy_fp_t *)");
        }
        if (0x15b < (int)uVar13) {
          __assert_fail("d_exp < 340 + d_exp_dist",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                        ,0x50,"int grisu3_diy_fp_cached_dec_pow(int, grisu3_diy_fp_t *)");
        }
        uVar8 = uVar13 + 0x15c >> 3;
        uVar17 = (uint)grisu3_diy_fp_pow_cache[uVar8].d_exp;
        if ((int)uVar13 < (int)uVar17) {
          __assert_fail("a_exp <= d_exp",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                        ,0x57,"int grisu3_diy_fp_cached_dec_pow(int, grisu3_diy_fp_t *)");
        }
        if ((int)(uVar17 + 8) <= (int)uVar13) {
          __assert_fail("d_exp < a_exp + d_exp_dist",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                        ,0x58,"int grisu3_diy_fp_cached_dec_pow(int, grisu3_diy_fp_t *)");
        }
        iVar9 = iVar21;
        if (uVar13 != uVar17) {
          uVar13 = uVar13 + ~uVar17;
          if (6 < uVar13) {
            __assert_fail("adj_exp >= 0 && adj_exp < 7",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_parse.h"
                          ,0xb8,"int grisu3_diy_fp_encode_double(uint64_t, int, int, int, double *)"
                         );
          }
          uVar18 = gVar27.f >> 0x20;
          uVar20 = *(ulong *)(grisu3_diy_fp_encode_double_cp_10_lut + (ulong)uVar13 * 0x10) &
                   0xffffffff;
          uVar24 = *(ulong *)(grisu3_diy_fp_encode_double_cp_10_lut + (ulong)uVar13 * 0x10) >> 0x20;
          uVar19 = uVar24 * (uint)gVar27.f;
          uVar15 = uVar18 * uVar20;
          auVar3._8_4_ = gVar27.e +
                         *(int *)(grisu3_diy_fp_encode_double_cp_10_lut + (ulong)uVar13 * 0x10 + 8)
                         + 0x40;
          auVar3._0_8_ = ((uVar19 & 0xffffffff) +
                          (uVar15 & 0xffffffff) + (uVar20 * (uint)gVar27.f >> 0x20) + 0x80000000 >>
                         0x20) + (uVar19 >> 0x20) + (uVar15 >> 0x20) + uVar24 * uVar18;
          iVar9 = iVar21 + 4;
          if ((int)(iVar23 + 1 + uVar13) < 0x14) {
            iVar9 = iVar21;
          }
        }
        uVar19 = auVar3._0_8_ >> 0x20;
        uVar18 = grisu3_diy_fp_pow_cache[uVar8].fract >> 0x20;
        uVar24 = grisu3_diy_fp_pow_cache[uVar8].fract & 0xffffffff;
        uVar15 = uVar18 * auVar3._0_4_;
        uVar20 = uVar19 * uVar24;
        n.f = ((uVar15 & 0xffffffff) + (uVar20 & 0xffffffff) + (auVar3._0_4_ * uVar24 >> 0x20) +
               0x80000000 >> 0x20) + (uVar15 >> 0x20) + (uVar20 >> 0x20) + uVar19 * uVar18;
        iVar14 = (int)grisu3_diy_fp_pow_cache[uVar8].b_exp + auVar3._8_4_ + 0x40;
        n.e = iVar14;
        n._12_4_ = 0;
        gVar27 = grisu3_diy_fp_normalize(n);
        uVar18 = gVar27.f;
        iVar21 = gVar27.e;
        iVar23 = 0x40;
        if (-0x472 < iVar21) {
          iVar23 = -(iVar21 + 0x432);
        }
        iVar16 = 0;
        if (iVar21 < -0x432) {
          iVar16 = iVar23;
        }
        iVar23 = (9 - (uint)(iVar9 == 0)) + iVar9 << ((char)iVar14 - (char)gVar27.e & 0x1fU);
        if (0x3c < iVar16) {
          bVar7 = (char)iVar16 - 0x3e;
          uVar18 = uVar18 >> (bVar7 & 0x3f);
          iVar21 = iVar21 + iVar16 + -0x3e;
          iVar23 = (iVar23 >> (bVar7 & 0x1f)) + 9;
          iVar16 = 0x3e;
        }
        uVar15 = uVar18 >> ((byte)iVar16 & 0x3f);
        iVar21 = iVar21 + iVar16;
        uVar8 = (uint)(1L << ((byte)iVar16 - 1 & 0x3f));
        iVar9 = iVar23 + uVar8 * 8;
        if ((iVar9 <= iVar16) && (uVar15 = uVar15 + 1, (uVar15 & 0x20000000000000) != 0)) {
          uVar15 = uVar15 >> 1;
          iVar21 = iVar21 + 1;
        }
        uVar24 = uVar15;
        if (0x1fffffffffffff < uVar15) {
          do {
            uVar15 = uVar24 >> 1;
            iVar21 = iVar21 + 1;
            uVar19 = uVar24 >> 0x36;
            uVar24 = uVar15;
          } while (uVar19 != 0);
        }
        dVar26 = 0.0;
        if (-0x433 < iVar21) {
          uVar24 = uVar15 & 0x10000000000000;
          bVar25 = uVar24 == 0;
          if (iVar21 != -0x432) {
            do {
              if (uVar24 != 0) break;
              uVar19 = uVar15 * 2;
              iVar14 = iVar21 + -1;
              uVar24 = uVar15 & 0x8000000000000;
              bVar25 = uVar24 == 0;
              bVar2 = -0x431 < iVar21;
              uVar15 = uVar19;
              iVar21 = iVar14;
            } while (bVar2);
          }
          uVar19 = (ulong)(iVar21 + 0x433) << 0x34;
          uVar24 = 0;
          if (!bVar25) {
            uVar24 = uVar19;
          }
          if (iVar21 != -0x432) {
            uVar24 = uVar19;
          }
          dVar26 = (double)(uVar15 & 0xfffffffffffff | uVar24);
        }
        iVar21 = (uVar8 & (uint)uVar18) * 8;
        *result = dVar26;
        if (((int)(uVar8 * 8 - iVar23) < iVar21) && (iVar21 < iVar9)) {
          dVar26 = strtod(buf,(char **)&local_38);
          *result = dVar26;
          if (local_38 < pbVar12) {
            return (char *)local_38;
          }
          return (char *)pbVar12;
        }
        goto LAB_00123f75;
      }
      dVar26 = (double)(long)uVar18;
      switch(uVar13 - iVar23) {
      case 1:
        dVar26 = dVar26 * 10.0;
        break;
      case 2:
        dVar26 = dVar26 * 100.0;
        break;
      case 3:
        dVar26 = dVar26 * 1000.0;
        break;
      case 4:
        dVar26 = dVar26 * 10000.0;
        break;
      case 5:
        dVar26 = dVar26 * 100000.0;
        break;
      case 6:
        dVar26 = dVar26 * 1000000.0;
        break;
      case 7:
        dVar26 = dVar26 * 10000000.0;
        break;
      case 8:
        dVar26 = dVar26 * 100000000.0;
        break;
      case 9:
        dVar26 = dVar26 * 1000000000.0;
        break;
      case 10:
        dVar26 = dVar26 * 10000000000.0;
        break;
      case 0xb:
        dVar26 = dVar26 * 100000000000.0;
        break;
      case 0xc:
        dVar26 = dVar26 * 1000000000000.0;
        break;
      case 0xd:
        dVar26 = dVar26 * 10000000000000.0;
        break;
      case 0xe:
        dVar26 = dVar26 * 100000000000000.0;
        break;
      case 0xf:
        dVar26 = dVar26 * 1e+15;
        break;
      case 0x10:
        dVar26 = dVar26 * 1e+16;
        break;
      case 0x11:
        dVar26 = dVar26 * 1e+17;
        break;
      case 0x12:
        dVar26 = dVar26 * 1e+18;
        break;
      case 0x13:
        dVar26 = dVar26 * 1e+19;
        break;
      case 0x14:
        dVar26 = dVar26 * 1e+20;
        break;
      case 0x15:
        dVar26 = dVar26 * 1e+21;
        break;
      case 0x16:
        dVar26 = dVar26 * 1e+22;
        break;
      case 0xffffffea:
        dVar26 = dVar26 / 1e+22;
        break;
      case 0xffffffeb:
        dVar26 = dVar26 / 1e+21;
        break;
      case 0xffffffec:
        dVar26 = dVar26 / 1e+20;
        break;
      case 0xffffffed:
        dVar26 = dVar26 / 1e+19;
        break;
      case 0xffffffee:
        dVar26 = dVar26 / 1e+18;
        break;
      case 0xffffffef:
        dVar26 = dVar26 / 1e+17;
        break;
      case 0xfffffff0:
        dVar26 = dVar26 / 1e+16;
        break;
      case 0xfffffff1:
        dVar26 = dVar26 / 1e+15;
        break;
      case 0xfffffff2:
        dVar26 = dVar26 / 100000000000000.0;
        break;
      case 0xfffffff3:
        dVar26 = dVar26 / 10000000000000.0;
        break;
      case 0xfffffff4:
        dVar26 = dVar26 / 1000000000000.0;
        break;
      case 0xfffffff5:
        dVar26 = dVar26 / 100000000000.0;
        break;
      case 0xfffffff6:
        dVar26 = dVar26 / 10000000000.0;
        break;
      case 0xfffffff7:
        dVar26 = dVar26 / 1000000000.0;
        break;
      case 0xfffffff8:
        dVar26 = dVar26 / 100000000.0;
        break;
      case 0xfffffff9:
        dVar26 = dVar26 / 10000000.0;
        break;
      case 0xfffffffa:
        dVar26 = dVar26 / 1000000.0;
        break;
      case 0xfffffffb:
        dVar26 = dVar26 / 100000.0;
        break;
      case 0xfffffffc:
        dVar26 = dVar26 / 10000.0;
        break;
      case 0xfffffffd:
        dVar26 = dVar26 / 1000.0;
        break;
      case 0xfffffffe:
        dVar26 = dVar26 / 100.0;
        break;
      case 0xffffffff:
        dVar26 = dVar26 / 10.0;
      }
    }
    else {
      dVar26 = INFINITY;
    }
  }
  *result = dVar26;
LAB_00123f75:
  if (cVar1 == '-') {
    *result = (double)((ulong)dVar26 ^ (ulong)DAT_00134ad0);
    return (char *)pbVar12;
  }
  return (char *)pbVar12;
}

Assistant:

static inline const char *parse_double(const char *buf, size_t len, double *result)
{
    return grisu3_parse_double(buf, len, result);
}